

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O1

void Sim_SymmsStructCompute(Abc_Ntk_t *pNtk,Vec_Ptr_t *vMatrs,Vec_Ptr_t *vSuppFun)

{
  void ***pppvVar1;
  void ***pppvVar2;
  size_t __size;
  void ***pppvVar3;
  void *pvVar4;
  Abc_Obj_t *pNode;
  Extra_BitMat_t *p;
  uint uVar5;
  int iVar6;
  int iVar7;
  Vec_Ptr_t *pVVar8;
  undefined8 *puVar9;
  int *pMap;
  Vec_Ptr_t *pVVar10;
  void **ppvVar11;
  Vec_Ptr_t *vNodesPi;
  Vec_Ptr_t *vNodesPi_00;
  Vec_Ptr_t *vNodesOther;
  int *piVar12;
  int *piVar13;
  int *piVar14;
  void ***pppvVar15;
  Abc_Obj_t *vSymms;
  Abc_Obj_t *pAVar16;
  int *piVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  
  if (0xfff5 < pNtk->vCis->nSize) {
    __assert_fail("Abc_NtkCiNum(pNtk) + 10 < (1<<16)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sim/simSymStr.c"
                  ,0x43,"void Sim_SymmsStructCompute(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  pVVar8 = Sim_ComputeStrSupp(pNtk);
  pNtk->vSupps = pVVar8;
  pVVar8 = pNtk->vCis;
  uVar5 = pVVar8->nSize;
  if (0 < (int)uVar5) {
    lVar23 = 0;
    do {
      pvVar4 = pVVar8->pArray[lVar23];
      puVar9 = (undefined8 *)malloc(0x10);
      *puVar9 = 0;
      puVar9[1] = 0;
      *(undefined8 **)((long)pvVar4 + 0x40) = puVar9;
      lVar23 = lVar23 + 1;
      pVVar8 = pNtk->vCis;
      uVar5 = pVVar8->nSize;
    } while (lVar23 < (int)uVar5);
  }
  lVar23 = (long)pNtk->vObjs->nSize;
  __size = lVar23 * 4;
  pMap = (int *)malloc(__size);
  if (0 < lVar23) {
    memset(pMap,0xff,__size);
  }
  if (0 < (int)uVar5) {
    ppvVar11 = pVVar8->pArray;
    uVar19 = 0;
    do {
      pMap[*(int *)((long)ppvVar11[uVar19] + 0x10)] = (int)uVar19;
      uVar19 = uVar19 + 1;
    } while (uVar5 != uVar19);
  }
  pVVar8 = Abc_NtkDfs(pNtk,0);
  if (0 < pVVar8->nSize) {
    lVar23 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar8->pArray[lVar23];
      pVVar10 = (Vec_Ptr_t *)malloc(0x10);
      pVVar10->nCap = 10;
      pVVar10->nSize = 0;
      ppvVar11 = (void **)malloc(0x50);
      pVVar10->pArray = ppvVar11;
      vNodesPi = (Vec_Ptr_t *)malloc(0x10);
      vNodesPi->nCap = 10;
      vNodesPi->nSize = 0;
      ppvVar11 = (void **)malloc(0x50);
      pppvVar1 = &vNodesPi->pArray;
      vNodesPi->pArray = ppvVar11;
      vNodesPi_00 = (Vec_Ptr_t *)malloc(0x10);
      vNodesPi_00->nCap = 10;
      vNodesPi_00->nSize = 0;
      ppvVar11 = (void **)malloc(0x50);
      pppvVar2 = &vNodesPi_00->pArray;
      vNodesPi_00->pArray = ppvVar11;
      vNodesOther = (Vec_Ptr_t *)malloc(0x10);
      vNodesOther->nCap = 10;
      vNodesOther->nSize = 0;
      ppvVar11 = (void **)malloc(0x50);
      pppvVar3 = &vNodesOther->pArray;
      vNodesOther->pArray = ppvVar11;
      Sim_SymmsBalanceCollect_rec(pNode,pVVar10);
      if (0 < pVVar10->nSize) {
        piVar12 = &vNodesPi->nSize;
        piVar13 = &vNodesPi_00->nSize;
        piVar14 = &vNodesOther->nSize;
        lVar20 = 0;
        do {
          pvVar4 = pVVar10->pArray[lVar20];
          uVar5 = *(uint *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x14) & 0xf;
          if ((uVar5 == 2) || (uVar5 == 5)) {
            if (((ulong)pvVar4 & 1) == 0) {
              uVar5 = vNodesPi_00->nCap;
              uVar18 = vNodesPi_00->nSize;
              pppvVar15 = pppvVar2;
              piVar17 = piVar13;
              if (uVar18 == uVar5) {
                if ((int)uVar5 < 0x10) {
                  if (*pppvVar2 == (void **)0x0) {
                    ppvVar11 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar11 = (void **)realloc(*pppvVar2,0x80);
                  }
                  iVar7 = 0x10;
                }
                else {
                  iVar7 = uVar5 * 2;
                  if (iVar7 <= (int)uVar5) goto LAB_0044eeff;
                  if (*pppvVar2 == (void **)0x0) {
                    ppvVar11 = (void **)malloc((ulong)uVar5 << 4);
                  }
                  else {
                    ppvVar11 = (void **)realloc(*pppvVar2,(ulong)uVar5 << 4);
                  }
                }
                vNodesPi_00->pArray = ppvVar11;
                vNodesPi_00->nCap = iVar7;
              }
            }
            else {
              uVar5 = vNodesPi->nCap;
              uVar18 = vNodesPi->nSize;
              pppvVar15 = pppvVar1;
              piVar17 = piVar12;
              if (uVar18 == uVar5) {
                if ((int)uVar5 < 0x10) {
                  if (*pppvVar1 == (void **)0x0) {
                    ppvVar11 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar11 = (void **)realloc(*pppvVar1,0x80);
                  }
                  iVar7 = 0x10;
                }
                else {
                  iVar7 = uVar5 * 2;
                  if (iVar7 <= (int)uVar5) goto LAB_0044eeff;
                  if (*pppvVar1 == (void **)0x0) {
                    ppvVar11 = (void **)malloc((ulong)uVar5 << 4);
                  }
                  else {
                    ppvVar11 = (void **)realloc(*pppvVar1,(ulong)uVar5 << 4);
                  }
                }
                vNodesPi->pArray = ppvVar11;
                vNodesPi->nCap = iVar7;
              }
            }
          }
          else {
            uVar5 = vNodesOther->nCap;
            uVar18 = vNodesOther->nSize;
            pppvVar15 = pppvVar3;
            piVar17 = piVar14;
            if (uVar18 == uVar5) {
              if ((int)uVar5 < 0x10) {
                if (*pppvVar3 == (void **)0x0) {
                  ppvVar11 = (void **)malloc(0x80);
                }
                else {
                  ppvVar11 = (void **)realloc(*pppvVar3,0x80);
                }
                iVar7 = 0x10;
              }
              else {
                iVar7 = uVar5 * 2;
                if (iVar7 <= (int)uVar5) goto LAB_0044eeff;
                if (*pppvVar3 == (void **)0x0) {
                  ppvVar11 = (void **)malloc((ulong)uVar5 << 4);
                }
                else {
                  ppvVar11 = (void **)realloc(*pppvVar3,(ulong)uVar5 << 4);
                }
              }
              vNodesOther->pArray = ppvVar11;
              vNodesOther->nCap = iVar7;
            }
          }
LAB_0044eeff:
          ppvVar11 = *pppvVar15;
          *piVar17 = uVar18 + 1;
          ppvVar11[(int)uVar18] = pvVar4;
          lVar20 = lVar20 + 1;
        } while (lVar20 < pVVar10->nSize);
      }
      vSymms = (Abc_Obj_t *)malloc(0x10);
      vSymms->pNtk = (Abc_Ntk_t *)0x10;
      pAVar16 = (Abc_Obj_t *)malloc(0x40);
      vSymms->pNext = pAVar16;
      Sim_SymmsAppendFromGroup(pNtk,vNodesPi,vNodesOther,(Vec_Int_t *)vSymms,pMap);
      pAVar16 = vSymms;
      Sim_SymmsAppendFromGroup(pNtk,vNodesPi_00,vNodesOther,(Vec_Int_t *)vSymms,pMap);
      iVar7 = vNodesOther->nSize;
      if (0 < (long)iVar7) {
        ppvVar11 = *pppvVar3;
        lVar20 = 0;
        do {
          lVar22 = *(long *)(((ulong)ppvVar11[lVar20] & 0xfffffffffffffffe) + 0x40);
          if (0 < *(int *)(lVar22 + 4)) {
            lVar24 = 0;
            do {
              uVar5 = *(uint *)(*(long *)(lVar22 + 8) + lVar24 * 4);
              iVar6 = Sim_SymmsIsCompatibleWithNodes(pNtk,uVar5,vNodesOther,(int *)pAVar16);
              if (((iVar6 != 0) &&
                  (iVar6 = Sim_SymmsIsCompatibleWithGroup(uVar5,vNodesPi,pMap), iVar6 != 0)) &&
                 (iVar6 = Sim_SymmsIsCompatibleWithGroup(uVar5,vNodesPi_00,pMap), iVar6 != 0)) {
                Vec_IntPushUnique((Vec_Int_t *)vSymms,uVar5);
              }
              lVar24 = lVar24 + 1;
            } while (lVar24 < *(int *)(lVar22 + 4));
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 != iVar7);
      }
      if (pVVar10->pArray != (void **)0x0) {
        free(pVVar10->pArray);
        pVVar10->pArray = (void **)0x0;
      }
      free(pVVar10);
      if (*pppvVar1 != (void **)0x0) {
        free(*pppvVar1);
        *pppvVar1 = (void **)0x0;
      }
      free(vNodesPi);
      if (*pppvVar2 != (void **)0x0) {
        free(*pppvVar2);
        *pppvVar2 = (void **)0x0;
      }
      free(vNodesPi_00);
      if (*pppvVar3 != (void **)0x0) {
        free(*pppvVar3);
        *pppvVar3 = (void **)0x0;
      }
      free(vNodesOther);
      (pNode->field_6).pCopy = vSymms;
      lVar23 = lVar23 + 1;
    } while (lVar23 < pVVar8->nSize);
  }
  pVVar10 = pNtk->vCos;
  if (0 < pVVar10->nSize) {
    lVar23 = 0;
    do {
      uVar19 = *(ulong *)(*(long *)(*(long *)(*pVVar10->pArray[lVar23] + 0x20) + 8) +
                         (long)**(int **)((long)pVVar10->pArray[lVar23] + 0x20) * 8);
      uVar5 = *(uint *)(uVar19 + 0x14) & 0xf;
      if ((uVar5 != 2) && (uVar5 != 5)) {
        if (**(int **)(uVar19 & 0xfffffffffffffffe) != 3) {
          __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                        ,0x18d,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
        }
        if ((*(uint *)((long)(uVar19 & 0xfffffffffffffffe) + 0x14) & 0xf) != 1) {
          if ((vMatrs->nSize <= lVar23) || (vSuppFun->nSize <= lVar23)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          p = (Extra_BitMat_t *)vMatrs->pArray[lVar23];
          lVar20 = *(long *)(uVar19 + 0x40);
          pvVar4 = vSuppFun->pArray[lVar23];
          iVar7 = Extra_BitMatrixReadSize(p);
          if (0 < iVar7) {
            iVar6 = 0;
            do {
              Extra_BitMatrixInsert1(p,iVar6,iVar6);
              iVar6 = iVar6 + 1;
            } while (iVar7 != iVar6);
          }
          if (0 < *(int *)(lVar20 + 4)) {
            lVar22 = 0;
            do {
              uVar5 = *(uint *)(*(long *)(lVar20 + 8) + lVar22 * 4);
              uVar18 = 1 << ((byte)uVar5 & 0x1f) &
                       *(uint *)((long)pvVar4 + (ulong)(uVar5 >> 3 & 0x1ffc));
              uVar21 = 1 << ((byte)(uVar5 >> 0x10) & 0x1f) &
                       *(uint *)((long)pvVar4 + (ulong)(uVar5 >> 0x15) * 4);
              if ((uVar18 != 0) != (uVar21 != 0)) {
                __assert_fail("Sim_HasBit(pSupport, Ind1) == Sim_HasBit(pSupport, Ind2)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sim/simSymStr.c"
                              ,0x1c5,
                              "void Sim_SymmsTransferToMatrix(Extra_BitMat_t *, Vec_Int_t *, unsigned int *)"
                             );
              }
              if ((uVar18 != 0) && (uVar21 != 0)) {
                Extra_BitMatrixInsert1(p,uVar5 & 0xffff,uVar5 >> 0x10);
                Extra_BitMatrixInsert2(p,uVar5 & 0xffff,uVar5 >> 0x10);
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 < *(int *)(lVar20 + 4));
          }
        }
      }
      lVar23 = lVar23 + 1;
      pVVar10 = pNtk->vCos;
    } while (lVar23 < pVVar10->nSize);
  }
  Sim_UtilInfoFree(pNtk->vSupps);
  pNtk->vSupps = (Vec_Ptr_t *)0x0;
  pVVar10 = pNtk->vCis;
  if (0 < pVVar10->nSize) {
    lVar23 = 0;
    do {
      pvVar4 = *(void **)((long)pVVar10->pArray[lVar23] + 0x40);
      if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar4 + 8));
        *(undefined8 *)((long)pvVar4 + 8) = 0;
      }
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
      }
      lVar23 = lVar23 + 1;
      pVVar10 = pNtk->vCis;
    } while (lVar23 < pVVar10->nSize);
  }
  if (0 < pVVar8->nSize) {
    lVar23 = 0;
    do {
      pvVar4 = *(void **)((long)pVVar8->pArray[lVar23] + 0x40);
      if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar4 + 8));
        *(undefined8 *)((long)pvVar4 + 8) = 0;
      }
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 < pVVar8->nSize);
  }
  if (pVVar8->pArray != (void **)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (void **)0x0;
  }
  if (pVVar8 != (Vec_Ptr_t *)0x0) {
    free(pVVar8);
  }
  if (pMap == (int *)0x0) {
    return;
  }
  free(pMap);
  return;
}

Assistant:

void Sim_SymmsStructCompute( Abc_Ntk_t * pNtk, Vec_Ptr_t * vMatrs, Vec_Ptr_t * vSuppFun )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pTemp;
    int * pMap, i;

    assert( Abc_NtkCiNum(pNtk) + 10 < (1<<16) );

    // get the structural support
    pNtk->vSupps = Sim_ComputeStrSupp( pNtk );
    // set elementary info for the CIs
    Abc_NtkForEachCi( pNtk, pTemp, i )
        SIM_SET_SYMMS( pTemp, Vec_IntAlloc(0) );
    // create the map of CI ids into their numbers
    pMap = Sim_SymmsCreateMap( pNtk );
    // collect the nodes in the TFI cone of this output
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pTemp, i )
    {
//        if ( Abc_NodeIsConst(pTemp) )
//            continue;
        Sim_SymmsStructComputeOne( pNtk, pTemp, pMap );
    }
    // collect the results for the COs;
    Abc_NtkForEachCo( pNtk, pTemp, i )
    {
//printf( "Output %d:\n", i );
        pTemp = Abc_ObjFanin0(pTemp);
        if ( Abc_ObjIsCi(pTemp) || Abc_AigNodeIsConst(pTemp) )
            continue;
        Sim_SymmsTransferToMatrix( (Extra_BitMat_t *)Vec_PtrEntry(vMatrs, i), SIM_READ_SYMMS(pTemp), (unsigned *)Vec_PtrEntry(vSuppFun, i) );
    }
    // clean the intermediate results
    Sim_UtilInfoFree( pNtk->vSupps );
    pNtk->vSupps = NULL;
    Abc_NtkForEachCi( pNtk, pTemp, i )
        Vec_IntFree( SIM_READ_SYMMS(pTemp) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pTemp, i )
//        if ( !Abc_NodeIsConst(pTemp) )
            Vec_IntFree( SIM_READ_SYMMS(pTemp) );
    Vec_PtrFree( vNodes );
    ABC_FREE( pMap );
}